

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_variables.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBVariablesInit(ClientContext *context,TableFunctionInitInput *input)

{
  ClientConfig *pCVar1;
  pointer pDVar2;
  __node_base *p_Var3;
  VariableData data;
  _Head_base<0UL,_duckdb::DuckDBVariablesData_*,_false> local_90;
  VariableData local_88;
  
  make_uniq<duckdb::DuckDBVariablesData>();
  pCVar1 = ClientConfig::GetConfig((ClientContext *)input);
  p_Var3 = &(pCVar1->user_variables)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    VariableData::VariableData(&local_88);
    ::std::__cxx11::string::_M_assign((string *)&local_88);
    Value::operator=(&local_88.value,(Value *)(p_Var3 + 5));
    pDVar2 = unique_ptr<duckdb::DuckDBVariablesData,_std::default_delete<duckdb::DuckDBVariablesData>,_true>
             ::operator->((unique_ptr<duckdb::DuckDBVariablesData,_std::default_delete<duckdb::DuckDBVariablesData>,_true>
                           *)&local_90);
    ::std::vector<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>::
    emplace_back<duckdb::VariableData>
              (&(pDVar2->variables).
                super_vector<duckdb::VariableData,_std::allocator<duckdb::VariableData>_>,&local_88)
    ;
    VariableData::~VariableData(&local_88);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_90._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBVariablesInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBVariablesData>();
	auto &config = ClientConfig::GetConfig(context);

	for (auto &entry : config.user_variables) {
		VariableData data;
		data.name = entry.first;
		data.value = entry.second;
		result->variables.push_back(std::move(data));
	}
	return std::move(result);
}